

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangularVolumeRecord1.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::RectangularVolumeRecord1::RectangularVolumeRecord1
          (RectangularVolumeRecord1 *this,KUINT8 Index,WorldCoordinates *CornerLocation,
          Vector *RectangleLength,EulerAngles *Orientation)

{
  KFLOAT64 KVar1;
  KFLOAT32 KVar2;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__RectangularVolumeRecord1_002266f0;
  (this->m_CornerLocation).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00225228;
  KVar1 = CornerLocation->m_f64Y;
  (this->m_CornerLocation).m_f64X = CornerLocation->m_f64X;
  (this->m_CornerLocation).m_f64Y = KVar1;
  (this->m_CornerLocation).m_f64Z = CornerLocation->m_f64Z;
  (this->m_RecLength).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002251d0;
  KVar2 = RectangleLength->m_f32Y;
  (this->m_RecLength).m_f32X = RectangleLength->m_f32X;
  (this->m_RecLength).m_f32Y = KVar2;
  (this->m_RecLength).m_f32Z = RectangleLength->m_f32Z;
  (this->m_Ori).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__EulerAngles_00224d08;
  KVar2 = Orientation->m_f32Theta;
  (this->m_Ori).m_f32Psi = Orientation->m_f32Psi;
  (this->m_Ori).m_f32Theta = KVar2;
  (this->m_Ori).m_f32Phi = Orientation->m_f32Phi;
  (this->super_EnvironmentRecord).m_ui8Index = Index;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x500000;
  (this->super_EnvironmentRecord).m_ui16Length = 0x180;
  return;
}

Assistant:

RectangularVolumeRecord1::RectangularVolumeRecord1( KUINT8 Index, const WorldCoordinates & CornerLocation, const Vector & RectangleLength,
        const EulerAngles & Orientation ) :
    m_CornerLocation( CornerLocation ),
    m_RecLength( RectangleLength ),
    m_Ori( Orientation )
{
    m_ui8Index = Index;
    m_ui32EnvRecTyp = RectangularVolumeRecord1Type;
    m_ui16Length = ( RECTANGLE_VOLUME_RECORD_1_SIZE - EnvironmentRecord::ENVIRONMENT_RECORD_SIZE ) * 8;
}